

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int libssh2_session_supported_algs(LIBSSH2_SESSION *session,int method_type,char ***algs)

{
  uint uVar1;
  int iVar2;
  LIBSSH2_KEX_METHOD **ppLVar3;
  char **ppcVar4;
  uint uVar5;
  LIBSSH2_CRYPT_METHOD *pLVar6;
  char *errmsg;
  uint uVar7;
  ulong uVar8;
  
  if (algs == (char ***)0x0) {
    errmsg = "algs must not be NULL";
LAB_00114db1:
    iVar2 = -0x27;
  }
  else {
    switch(method_type) {
    case 0:
      ppLVar3 = libssh2_kex_methods;
      break;
    case 1:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)libssh2_hostkey_methods();
      break;
    case 2:
    case 3:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)libssh2_crypt_methods();
      break;
    case 4:
    case 5:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)_libssh2_mac_methods();
      break;
    case 6:
    case 7:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)_libssh2_comp_methods(session);
      break;
    default:
      errmsg = "Unknown method type";
      iVar2 = -0x21;
      goto LAB_00114e73;
    case 10:
      ppLVar3 = (LIBSSH2_KEX_METHOD **)0x0;
    }
    if ((LIBSSH2_CRYPT_METHOD **)ppLVar3 != (LIBSSH2_CRYPT_METHOD **)0x0) {
      pLVar6 = (LIBSSH2_CRYPT_METHOD *)*ppLVar3;
      uVar7 = 0;
      if (pLVar6 != (LIBSSH2_CRYPT_METHOD *)0x0) {
        uVar1 = 1;
        do {
          uVar7 = (uVar7 + 1) - (uint)(pLVar6->name == (char *)0x0);
          pLVar6 = ((LIBSSH2_CRYPT_METHOD **)ppLVar3)[uVar1];
          uVar1 = uVar1 + 1;
        } while (pLVar6 != (LIBSSH2_CRYPT_METHOD *)0x0);
      }
      if (uVar7 != 0) {
        ppcVar4 = (char **)(*session->alloc)((ulong)uVar7 << 3,&session->abstract);
        *algs = ppcVar4;
        if (ppcVar4 == (char **)0x0) {
          errmsg = "Memory allocation failed";
          iVar2 = -6;
          goto LAB_00114e73;
        }
        pLVar6 = (LIBSSH2_CRYPT_METHOD *)*ppLVar3;
        uVar1 = 0;
        if (pLVar6 != (LIBSSH2_CRYPT_METHOD *)0x0) {
          uVar5 = 1;
          do {
            if (pLVar6->name != (char *)0x0) {
              uVar8 = (ulong)uVar1;
              uVar1 = uVar1 + 1;
              (*algs)[uVar8] = pLVar6->name;
            }
            pLVar6 = ((LIBSSH2_CRYPT_METHOD **)ppLVar3)[uVar5];
          } while ((pLVar6 != (LIBSSH2_CRYPT_METHOD *)0x0) && (uVar5 = uVar5 + 1, uVar1 < uVar7));
        }
        if (uVar1 == uVar7) {
          return uVar7;
        }
        (*session->free)(*algs,&session->abstract);
        *algs = (char **)0x0;
        errmsg = "Internal error";
        goto LAB_00114db1;
      }
    }
    errmsg = "No algorithm found";
    iVar2 = -0x22;
  }
LAB_00114e73:
  iVar2 = _libssh2_error(session,iVar2,errmsg);
  return iVar2;
}

Assistant:

LIBSSH2_API int libssh2_session_supported_algs(LIBSSH2_SESSION* session,
                                               int method_type,
                                               const char ***algs)
{
    unsigned int i;
    unsigned int j;
    unsigned int ialg;
    const LIBSSH2_COMMON_METHOD **mlist;

    /* to prevent coredumps due to dereferencing of NULL */
    if(!algs)
        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "algs must not be NULL");

    switch(method_type) {
    case LIBSSH2_METHOD_KEX:
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_kex_methods;
        break;

    case LIBSSH2_METHOD_HOSTKEY:
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_hostkey_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_CS:
    case LIBSSH2_METHOD_CRYPT_SC:
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_MAC_CS:
    case LIBSSH2_METHOD_MAC_SC:
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_COMP_CS:
    case LIBSSH2_METHOD_COMP_SC:
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_SIGN_ALGO:
        /* no built-in supported list due to backend support */
        mlist = NULL;
        break;

    default:
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unknown method type");
    }  /* switch */

    /* weird situation */
    if(!mlist)
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "No algorithm found");

    /*
      mlist is looped through twice. The first time to find the number od
      supported algorithms (needed to allocate the proper size of array) and
      the second time to actually copy the pointers.  Typically this function
      will not be called often (typically at the beginning of a session) and
      the number of algorithms (i.e. number of iterations in one loop) will
      not be high (typically it will not exceed 20) for quite a long time.

      So double looping really shouldn't be an issue and it is definitely a
      better solution than reallocation several times.
    */

    /* count the number of supported algorithms */
    for(i = 0, ialg = 0; mlist[i]; i++) {
        /* do not count fields with NULL name */
        if(mlist[i]->name)
            ialg++;
    }

    /* weird situation, no algorithm found */
    if(ialg == 0)
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "No algorithm found");

    /* allocate buffer */
    *algs = (const char **) LIBSSH2_ALLOC(session, ialg*sizeof(const char *));
    if(!*algs) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Memory allocation failed");
    }
    /* Past this point *algs must be deallocated in case of an error!! */

    /* copy non-NULL pointers only */
    for(i = 0, j = 0; mlist[i] && j < ialg; i++) {
        if(!mlist[i]->name) {
            /* maybe a weird situation but if it occurs, do not include NULL
               pointers */
            continue;
        }

        /* note that [] has higher priority than * (dereferencing) */
        (*algs)[j++] = mlist[i]->name;
    }

    /* correct number of pointers copied? (test the code above) */
    if(j != ialg) {
        /* deallocate buffer */
        LIBSSH2_FREE(session, (void *)*algs);
        *algs = NULL;

        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "Internal error");
    }

    return ialg;
}